

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int send_streams_blocked(quicly_conn_t *conn,int uni,quicly_send_context_t *s)

{
  uint64_t uVar1;
  byte *pbVar2;
  _func_void_void_ptr_char_ptr_varargs *p_Var3;
  int iVar4;
  quicly_sent_t *in_RAX;
  uint64_t *puVar5;
  uint8_t *puVar6;
  anon_struct_80_2_8a8f9515_for_max_streams *paVar7;
  quicly_sent_t *sent;
  
  puVar5 = (conn->egress).retire_cid.sequences + (ulong)(uni == 0) * 2 + -7;
  iVar4 = 0;
  if ((uint64_t *)*puVar5 != puVar5) {
    paVar7 = &(conn->egress).max_streams;
    if (uni == 0) {
      paVar7 = (anon_struct_80_2_8a8f9515_for_max_streams *)&(conn->egress).max_streams.bidi;
    }
    uVar1 = (paVar7->uni).count;
    if (uVar1 != *(long *)((conn->egress).retire_cid.sequences[(ulong)(uni == 0) * 2 + -6] - 0xf8) /
                 4) {
      __assert_fail("max_streams->count == oldest_blocked_stream->stream_id / 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xe63,"int send_streams_blocked(quicly_conn_t *, int, quicly_send_context_t *)"
                   );
    }
    iVar4 = 0;
    if ((paVar7->uni).blocked_sender.max_committed < (long)uVar1) {
      sent = in_RAX;
      iVar4 = allocate_ack_eliciting_frame(conn,s,9,&sent,on_ack_streams_blocked);
      if (iVar4 == 0) {
        pbVar2 = s->dst;
        uVar1 = (paVar7->uni).count;
        *pbVar2 = uni == 0 ^ 0x17;
        puVar6 = ptls_encode_quicint(pbVar2 + 1,uVar1);
        s->dst = puVar6;
        (sent->data).max_streams.uni = uni;
        quicly_maxsender_record
                  (&(paVar7->uni).blocked_sender,(paVar7->uni).count,
                   &(sent->data).max_stream_data.args);
        puVar5 = &(conn->super).stats.num_frames_sent.streams_blocked;
        *puVar5 = *puVar5 + 1;
        p_Var3 = (conn->super).tracer.cb;
        if (p_Var3 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
          (*p_Var3)((conn->super).tracer.ctx,
                    "{\"type\":\"streams-blocked-send\", \"time\":%lld, \"maximum\":%llu, \"is-unidirectional\":%lld}\n"
                    ,(conn->stash).now,(paVar7->uni).count,uni);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int send_streams_blocked(quicly_conn_t *conn, int uni, quicly_send_context_t *s)
{
    quicly_linklist_t *blocked_list = uni ? &conn->egress.pending_streams.blocked.uni : &conn->egress.pending_streams.blocked.bidi;
    int ret;

    if (!quicly_linklist_is_linked(blocked_list))
        return 0;

    struct st_quicly_max_streams_t *max_streams = uni ? &conn->egress.max_streams.uni : &conn->egress.max_streams.bidi;
    quicly_stream_t *oldest_blocked_stream =
        (void *)((char *)blocked_list->next - offsetof(quicly_stream_t, _send_aux.pending_link.control));
    assert(max_streams->count == oldest_blocked_stream->stream_id / 4);

    if (!quicly_maxsender_should_send_blocked(&max_streams->blocked_sender, max_streams->count))
        return 0;

    quicly_sent_t *sent;
    if ((ret = allocate_ack_eliciting_frame(conn, s, QUICLY_STREAMS_BLOCKED_FRAME_CAPACITY, &sent, on_ack_streams_blocked)) != 0)
        return ret;
    s->dst = quicly_encode_streams_blocked_frame(s->dst, uni, max_streams->count);
    sent->data.streams_blocked.uni = uni;
    quicly_maxsender_record(&max_streams->blocked_sender, max_streams->count, &sent->data.streams_blocked.args);

    ++conn->super.stats.num_frames_sent.streams_blocked;
    QUICLY_PROBE(STREAMS_BLOCKED_SEND, conn, conn->stash.now, max_streams->count, uni);

    return 0;
}